

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  int iVar1;
  ulong in_RAX;
  ostream *poVar2;
  ulong uStack_18;
  Colour colour;
  
  uStack_18 = in_RAX;
  poVar2 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,'\n');
  if (getLineOfChars<(char)126>()::line == '\0') {
    uRam000000000018dfc0 = 0x7e7e7e7e7e7e7e;
    uRam000000000018dfc7._0_1_ = '~';
    uRam000000000018dfc7._1_1_ = '~';
    uRam000000000018dfc7._2_1_ = '~';
    uRam000000000018dfc7._3_1_ = '~';
    uRam000000000018dfc7._4_1_ = '~';
    uRam000000000018dfc7._5_1_ = '~';
    uRam000000000018dfc7._6_1_ = '~';
    uRam000000000018dfc7._7_1_ = '~';
    DAT_0018dfb0 = '~';
    DAT_0018dfb0_1._0_1_ = '~';
    DAT_0018dfb0_1._1_1_ = '~';
    DAT_0018dfb0_1._2_1_ = '~';
    DAT_0018dfb0_1._3_1_ = '~';
    DAT_0018dfb0_1._4_1_ = '~';
    DAT_0018dfb0_1._5_1_ = '~';
    DAT_0018dfb0_1._6_1_ = '~';
    uRam000000000018dfb8 = 0x7e7e7e7e7e7e7e;
    DAT_0018dfbf = 0x7e;
    DAT_0018dfa0 = '~';
    DAT_0018dfa0_1._0_1_ = '~';
    DAT_0018dfa0_1._1_1_ = '~';
    DAT_0018dfa0_1._2_1_ = '~';
    DAT_0018dfa0_1._3_1_ = '~';
    DAT_0018dfa0_1._4_1_ = '~';
    DAT_0018dfa0_1._5_1_ = '~';
    DAT_0018dfa0_1._6_1_ = '~';
    uRam000000000018dfa8._0_1_ = '~';
    uRam000000000018dfa8._1_1_ = '~';
    uRam000000000018dfa8._2_1_ = '~';
    uRam000000000018dfa8._3_1_ = '~';
    uRam000000000018dfa8._4_1_ = '~';
    uRam000000000018dfa8._5_1_ = '~';
    uRam000000000018dfa8._6_1_ = '~';
    uRam000000000018dfa8._7_1_ = '~';
    DAT_0018df90 = '~';
    DAT_0018df90_1._0_1_ = '~';
    DAT_0018df90_1._1_1_ = '~';
    DAT_0018df90_1._2_1_ = '~';
    DAT_0018df90_1._3_1_ = '~';
    DAT_0018df90_1._4_1_ = '~';
    DAT_0018df90_1._5_1_ = '~';
    DAT_0018df90_1._6_1_ = '~';
    uRam000000000018df98._0_1_ = '~';
    uRam000000000018df98._1_1_ = '~';
    uRam000000000018df98._2_1_ = '~';
    uRam000000000018df98._3_1_ = '~';
    uRam000000000018df98._4_1_ = '~';
    uRam000000000018df98._5_1_ = '~';
    uRam000000000018df98._6_1_ = '~';
    uRam000000000018df98._7_1_ = '~';
    getLineOfChars<(char)126>()::line = '~';
    getLineOfChars<(char)126>()::line_1._0_1_ = '~';
    getLineOfChars<(char)126>()::line_1._1_1_ = '~';
    getLineOfChars<(char)126>()::line_1._2_1_ = '~';
    getLineOfChars<(char)126>()::line_1._3_1_ = '~';
    getLineOfChars<(char)126>()::line_1._4_1_ = '~';
    getLineOfChars<(char)126>()::line_1._5_1_ = '~';
    getLineOfChars<(char)126>()::line_1._6_1_ = '~';
    uRam000000000018df88._0_1_ = '~';
    uRam000000000018df88._1_1_ = '~';
    uRam000000000018df88._2_1_ = '~';
    uRam000000000018df88._3_1_ = '~';
    uRam000000000018df88._4_1_ = '~';
    uRam000000000018df88._5_1_ = '~';
    uRam000000000018df88._6_1_ = '~';
    uRam000000000018df88._7_1_ = '~';
    DAT_0018dfcf = 0;
  }
  poVar2 = std::operator<<(poVar2,&getLineOfChars<(char)126>()::line);
  std::operator<<(poVar2,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(FileName);
  poVar2 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           (string *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                           currentTestRunInfo.super_Option<Catch::TestRunInfo>.nullableValue);
  poVar2 = std::operator<<(poVar2," is a Catch v");
  libraryVersion();
  Catch::operator<<((ostream *)poVar2,&libraryVersion::version);
  poVar2 = std::operator<<(poVar2," host application.\n");
  std::operator<<(poVar2,"Run with -? for options\n\n");
  iVar1 = (*(((this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0x11])();
  if (iVar1 != 0) {
    poVar2 = std::operator<<((ostream *)
                             (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                             "Randomness seeded to: ");
    (*(((this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config.
        super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_NonCopyable)._vptr_NonCopyable[0x11])();
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"\n\n");
  }
  (this->super_StreamingReporterBase<Catch::ConsoleReporter>).currentTestRunInfo.used = true;
  Colour::~Colour(&colour);
  return;
}

Assistant:

void ConsoleReporter::lazyPrintRunInfo() {
    stream << '\n' << getLineOfChars<'~'>() << '\n';
    Colour colour(Colour::SecondaryText);
    stream << currentTestRunInfo->name
        << " is a Catch v" << libraryVersion() << " host application.\n"
        << "Run with -? for options\n\n";

    if (m_config->rngSeed() != 0)
        stream << "Randomness seeded to: " << m_config->rngSeed() << "\n\n";

    currentTestRunInfo.used = true;
}